

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O1

string * __thiscall llvm::Twine::str_abi_cxx11_(string *__return_storage_ptr__,Twine *this)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  char *pcVar3;
  NodeKind NVar4;
  StringRef SVar5;
  SmallString<256U> Vec;
  SmallVectorImpl<char> local_120;
  undefined1 local_110 [256];
  
  NVar4 = this->RHSKind ^ EmptyKind;
  if (this->LHSKind == StdStringKind && NVar4 == NullKind) {
    puVar1 = (this->LHS).decUL;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    uVar2 = *puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,uVar2,puVar1[1] + uVar2);
  }
  else if (this->LHSKind == FormatvObjectKind && NVar4 == NullKind) {
    formatv_object_base::str_abi_cxx11_(__return_storage_ptr__,(this->LHS).formatvObject);
  }
  else {
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x100;
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_110;
    SVar5 = toStringRef(this,&local_120);
    pcVar3 = SVar5.Data;
    if (pcVar3 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + SVar5.Length);
    }
    if ((undefined1 *)
        local_120.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_110) {
      free(local_120.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Twine::str() const {
  // If we're storing only a std::string, just return it.
  if (LHSKind == StdStringKind && RHSKind == EmptyKind)
    return *LHS.stdString;

  // If we're storing a formatv_object, we can avoid an extra copy by formatting
  // it immediately and returning the result.
  if (LHSKind == FormatvObjectKind && RHSKind == EmptyKind)
    return LHS.formatvObject->str();

  // Otherwise, flatten and copy the contents first.
  SmallString<256> Vec;
  return toStringRef(Vec).str();
}